

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IPCFifoUnix.cpp
# Opt level: O2

bool __thiscall gnilk::IPCFifoUnix::ConnectTo(IPCFifoUnix *this,string *name)

{
  int iVar1;
  
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            (&this->fifoname,name);
  iVar1 = open((this->fifoname)._M_dataplus._M_p,2);
  this->rwfd = iVar1;
  if (iVar1 < 0) {
    if (this->isOwner == true) {
      close(this->fifofd);
    }
    perror("IPCFifoUnix::Open, open");
  }
  else {
    this->isOpen = true;
  }
  return -1 < iVar1;
}

Assistant:

bool IPCFifoUnix::ConnectTo(const std::string name) {
    fifoname = name;

    // Open it in Read/Write mode - note: this might not be supported everywhere
    rwfd = open(fifoname.c_str(), O_RDWR);
    if (rwfd < 0) {
        if (isOwner) {
            close(fifofd);
        }
        perror("IPCFifoUnix::Open, open");
        return false;
    }

    // All good - tag and bag em...
    isOpen = true;
    return true;


}